

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_archive.hpp
# Opt level: O2

void __thiscall
pstore::serialize::archive::database_reader::getn<pstore::gsl::span<char,_1l>,void>
          (database_reader *this,span<char,__1L> span)

{
  type distance;
  unique_pointer<const_unsigned_char> src;
  _Head_base<1UL,_void_(*)(const_unsigned_char_*),_false> local_30;
  _Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false> local_28;
  
  address::operator+=(&this->addr_,0);
  local_30._M_head_impl = (_func_void_uchar_ptr *)span.storage_.super_extent_type<_1L>.size_;
  distance = unsigned_cast<long>((long *)&stack0xffffffffffffffd0);
  database::getrou<unsigned_char,void>
            ((database *)&stack0xffffffffffffffd0,(typed_address<unsigned_char>)this->db_,
             (this->addr_).a_);
  address::operator+=(&this->addr_,distance);
  if (distance != 0) {
    memmove(span.storage_.data_,local_28._M_head_impl,distance);
  }
  std::unique_ptr<const_unsigned_char,_void_(*)(const_unsigned_char_*)>::~unique_ptr
            ((unique_ptr<const_unsigned_char,_void_(*)(const_unsigned_char_*)> *)
             &stack0xffffffffffffffd0);
  return;
}

Assistant:

void database_reader::getn (SpanType span) {
                using element_type = typename SpanType::element_type;

                // Adjust addr_ so that it is correctly aligned for element_type.
                auto const extra_for_alignment =
                    calc_alignment (addr_.absolute (), alignof (element_type));
                PSTORE_ASSERT (extra_for_alignment < sizeof (element_type));
                addr_ += extra_for_alignment;

                // Load the data.
                auto const size = unsigned_cast (span.size_bytes ());
                auto src = db_.getrou (typed_address<std::uint8_t> (addr_), size);
                addr_ += size;

                // Copy to the destination span.
                auto first = src.get ();
                std::copy (first, first + size, reinterpret_cast<std::uint8_t *> (span.data ()));
            }